

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O1

ColoredAp * __thiscall
dg::DOD::createAp(ColoredAp *__return_storage_ptr__,DOD *this,SparseBitvector *nodes,CDGraph *graph,
                 CDNode *node)

{
  pointer puVar1;
  bool bVar2;
  CDNode *pCVar3;
  pointer puVar4;
  node_iterator __begin2;
  ContainedType *n;
  ColoredAp CAp;
  _Head_base<0UL,_dg::CDNode_*,_false> local_180;
  anon_class_16_2_de1edd05 local_178;
  ColoredAp local_168;
  
  ColoredAp::ColoredAp(&local_168);
  puVar1 = (graph->_nodes).
           super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (graph->_nodes).
                super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    pCVar3 = (puVar4->_M_t).super___uniq_ptr_impl<dg::CDNode,_std::default_delete<dg::CDNode>_>._M_t
             .super__Tuple_impl<0UL,_dg::CDNode_*,_std::default_delete<dg::CDNode>_>.
             super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl;
    bVar2 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
            ::get(nodes,(ulong)pCVar3->_id);
    if (bVar2) {
      ColoredAp::createNode(&local_168,pCVar3);
    }
  }
  if (0x10 < (ulong)((long)local_168.Ap._nodes.
                           super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_168.Ap._nodes.
                          super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    if (local_168.Ap._nodes.
        super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_168.Ap._nodes.
        super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar4 = local_168.Ap._nodes.
               super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_180._M_head_impl =
             (puVar4->_M_t).super___uniq_ptr_impl<dg::CDNode,_std::default_delete<dg::CDNode>_>._M_t
             .super__Tuple_impl<0UL,_dg::CDNode_*,_std::default_delete<dg::CDNode>_>.
             super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl;
        pCVar3 = ColoredAp::getGNode(&local_168,local_180._M_head_impl);
        local_178.n = &local_180._M_head_impl;
        local_178.CAp = &local_168;
        foreachFirstReachable<dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>,dg::DOD::createAp(dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&,dg::CDGraph&,dg::CDNode*)::_lambda(dg::CDNode*)_1_>
                  (this,nodes,pCVar3,&local_178);
        puVar4 = puVar4 + 1;
      } while (puVar4 != local_168.Ap._nodes.
                         super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pCVar3 = ColoredAp::getNode(&local_168,node);
    if (8 < (ulong)((long)(pCVar3->super_ElemWithEdges<dg::CDNode>)._successors.
                          super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(pCVar3->super_ElemWithEdges<dg::CDNode>)._successors.
                         super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      ColoredAp::ColoredAp(__return_storage_ptr__,&local_168);
      goto LAB_001122c1;
    }
  }
  memset(__return_storage_ptr__,0,0x138);
  ColoredAp::ColoredAp(__return_storage_ptr__);
LAB_001122c1:
  std::
  _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_168._rev_mapping._M_h);
  std::
  _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_168._mapping._M_h);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)&local_168.reds,
             (_Link_type)
             local_168.reds._bits.
             super_map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::_M_erase((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)&local_168.blues,
             (_Link_type)
             local_168.blues._bits.
             super_map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<dg::CDNode_*,_dg::CDNode_*,_std::_Identity<dg::CDNode_*>,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
  ::_M_erase(&local_168.Ap._predicates._M_t,
             (_Link_type)
             local_168.Ap._predicates._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
  ::~vector(&local_168.Ap._nodes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.Ap._name._M_dataplus._M_p != &local_168.Ap._name.field_2) {
    operator_delete(local_168.Ap._name._M_dataplus._M_p,
                    local_168.Ap._name.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ColoredAp createAp(const ADT::SparseBitvector &nodes, CDGraph &graph,
                       CDNode *node) {
        ColoredAp CAp;
        CDGraph &Ap = CAp.Ap;

        // create nodes of graph
        for (auto *n : graph) {
            if (nodes.get(n->getID())) {
                CAp.createNode(n);
                // DBG(cda, "  - Ap has node " << n->getID() << " (which is " <<
                // nd->getID() << " in Ap)");
            }
        }

        assert(CAp.getNode(node) != nullptr);

        if (CAp.Ap.size() < 3) {
            return {}; // no DOD possible, bail out early
        }

        // Add edges. FIXME: we can use a better implementation
        for (auto *n : Ap) {
            auto *gn = CAp.getGNode(n);

            foreachFirstReachable(nodes, gn, [&](CDNode *cur) {
                auto *apn = CAp.getNode(cur);
                assert(apn);
                n->addSuccessor(apn);
                // DBG(cda, "  - Ap edge " << gn->getID() << " -> " <<
                // cur->getID());
            });
        }

        assert(CAp.getNode(node) && "node is not in Ap");
        if (CAp.getNode(node)->successors().size() < 2) {
            return {}; // no DOD possible, skip the rest of building colored Ap
        }

        return CAp;
    }